

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O2

void copywithendian(char *dest,char *src,int size,int islittle)

{
  long lVar1;
  char *pcVar2;
  
  if (islittle == 1) {
    for (lVar1 = 0; size != (int)lVar1; lVar1 = lVar1 + 1) {
      dest[lVar1] = src[lVar1];
    }
  }
  else {
    pcVar2 = dest + size;
    for (lVar1 = 0; pcVar2 = pcVar2 + -1, size != (int)lVar1; lVar1 = lVar1 + 1) {
      *pcVar2 = src[lVar1];
    }
  }
  return;
}

Assistant:

static void copywithendian (volatile char *dest, volatile const char *src,
                            int size, int islittle) {
  if (islittle == nativeendian.little) {
    while (size-- != 0)
      *(dest++) = *(src++);
  }
  else {
    dest += size - 1;
    while (size-- != 0)
      *(dest--) = *(src++);
  }
}